

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O2

void * tommy_hashlin_remove_existing(tommy_hashlin *hashlin,tommy_hashlin_node *node)

{
  long lVar1;
  tommy_hashlin_node **list;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  list = tommy_hashlin_bucket_ref(hashlin,node->key);
  tommy_list_remove_existing(list,node);
  hashlin->count = hashlin->count - 1;
  hashlin_shrink_step(hashlin);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return node->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashlin_remove_existing(tommy_hashlin* hashlin, tommy_hashlin_node* node)
{
	tommy_list_remove_existing(tommy_hashlin_bucket_ref(hashlin, node->key), node);

	--hashlin->count;

	hashlin_shrink_step(hashlin);

	return node->data;
}